

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# velocypack-common.h
# Opt level: O0

unsigned_long arangodb::velocypack::readIntFixedHelper<unsigned_long,1u,24u>(uint8_t *p)

{
  unsigned_long uVar1;
  byte *in_RDI;
  
  uVar1 = readIntFixedHelper<unsigned_long,0u,32u>(in_RDI + 1);
  return uVar1 | (ulong)*in_RDI << 0x18;
}

Assistant:

static inline T readIntFixedHelper(uint8_t const* p) noexcept {
  // bailout if nothing to shift or target type is too small for shift
  // to avoid compiler warning
  if constexpr (Bytes == 0 || sizeof(T) * 8 <= Shift) {
    return 0;
  } else {
    return readIntFixedHelper<T, Bytes - 1, Shift + 8>(p + 1) |
           (static_cast<T>(*p) << Shift);
    // for some reason MSVC detects possible operator precedence error here ~~^
    // ^
  }
}